

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::set_max_connections(torrent *this,int limit,bool state_update)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  error_code local_30;
  
  uVar4 = 0xffffff;
  if (0 < limit) {
    uVar4 = limit;
  }
  uVar3 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if (((uint)(uVar3 >> 0x21) & 0xffffff) != uVar4) {
    if (state_update) {
      state_updated(this);
      uVar3 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    }
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         uVar3 & 0xfe000001ffffffff | (ulong)(uVar4 & 0xffffff) << 0x21;
    update_want_peers(this);
    iVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if (((byte)iVar2 & state_update) == 1) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** set-max-connections: %d",
                 (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x21) & 0xffffff));
    }
    iVar2 = num_peers(this);
    if ((int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
             0xffffff) < iVar2) {
      iVar2 = num_peers(this);
      uVar1 = *(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_30,too_many_connections,(type *)0x0);
      disconnect_peers(this,iVar2 - ((uint)((ulong)uVar1 >> 0x21) & 0xffffff),&local_30);
    }
    if (state_update) {
      set_need_save_resume(this,(resume_data_flags_t)0x20);
    }
  }
  return;
}

Assistant:

void torrent::set_max_connections(int limit, bool const state_update)
	{
		TORRENT_ASSERT(is_single_thread());
		// TODO: perhaps 0 should actually mean 0
		if (limit <= 0) limit = (1 << 24) - 1;
		if (int(m_max_connections) == limit) return;
		if (state_update) state_updated();
		m_max_connections = aux::numeric_cast<std::uint32_t>(limit);
		update_want_peers();

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log() && state_update)
			debug_log("*** set-max-connections: %d", m_max_connections);
#endif

		if (num_peers() > int(m_max_connections))
		{
			disconnect_peers(num_peers() - m_max_connections
				, errors::too_many_connections);
		}

		if (state_update)
			set_need_save_resume(torrent_handle::if_config_changed);
	}